

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeImportSleep(TranslateToFuzzReader *this,Type type)

{
  string_view target;
  Expression *pEVar1;
  Call *pCVar2;
  initializer_list<wasm::Expression_*> __l;
  Expression *local_58;
  Expression *local_50;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_48;
  allocator_type local_29;
  
  pEVar1 = make(this,(Type)0x2);
  local_50 = make(this,(Type)0x2);
  target = (this->sleepImportName).super_IString.str;
  __l._M_len = 2;
  __l._M_array = &local_58;
  local_58 = pEVar1;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_48,__l,&local_29);
  pCVar2 = Builder::makeCall(&this->builder,(Name)target,&local_48,(Type)0x2,false);
  if (local_48.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Expression *)pCVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeImportSleep(Type type) {
  // Sleep for some ms, and return a given id.
  auto* ms = make(Type::i32);
  auto id = make(Type::i32);
  return builder.makeCall(sleepImportName, {ms, id}, Type::i32);
}